

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  int iVar1;
  sqlite3 *db;
  Table *pTVar2;
  AutoincInfo *pAVar3;
  int iVar4;
  Parse *pPVar5;
  
  iVar4 = 0;
  if (((pTab->tabFlags & 8) != 0) && (db = pParse->db, iVar4 = 0, (db->mDbFlags & 4) == 0)) {
    pPVar5 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar5 = pParse;
    }
    pTVar2 = (db->aDb[iDb].pSchema)->pSeqTab;
    if ((((pTVar2 == (Table *)0x0) || ((pTVar2->tabFlags & 0x20) != 0)) || (pTVar2->nModuleArg != 0)
        ) || (pTVar2->nCol != 2)) {
      pParse->nErr = pParse->nErr + 1;
      pParse->rc = 0x20b;
    }
    else {
      pAVar3 = (AutoincInfo *)&pPVar5->pAinc;
      do {
        pAVar3 = pAVar3->pNext;
        if (pAVar3 == (AutoincInfo *)0x0) {
          pAVar3 = (AutoincInfo *)sqlite3DbMallocRawNN(db,0x18);
          if (pAVar3 == (AutoincInfo *)0x0) {
            return 0;
          }
          pAVar3->pNext = pPVar5->pAinc;
          pPVar5->pAinc = pAVar3;
          pAVar3->pTab = pTab;
          pAVar3->iDb = iDb;
          iVar1 = pPVar5->nMem;
          iVar4 = iVar1 + 2;
          pAVar3->regCtr = iVar4;
          pPVar5->nMem = iVar1 + 4;
          return iVar4;
        }
      } while (pAVar3->pTab != pTab);
      iVar4 = pAVar3->regCtr;
    }
  }
  return iVar4;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  assert( pParse->db->aDb[iDb].pSchema!=0 );
  if( (pTab->tabFlags & TF_Autoincrement)!=0
   && (pParse->db->mDbFlags & DBFLAG_Vacuum)==0
  ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;
    Table *pSeqTab = pParse->db->aDb[iDb].pSchema->pSeqTab;

    /* Verify that the sqlite_sequence table exists and is an ordinary
    ** rowid table with exactly two columns.
    ** Ticket d8dc2b3a58cd5dc2918a1d4acb 2018-05-23 */
    if( pSeqTab==0
     || !HasRowid(pSeqTab)
     || IsVirtual(pSeqTab)
     || pSeqTab->nCol!=2
    ){
      pParse->nErr++;
      pParse->rc = SQLITE_CORRUPT_SEQUENCE;
      return 0;
    }

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRawNN(pParse->db, sizeof(*pInfo));
      if( pInfo==0 ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem +=2;       /* Rowid in sqlite_sequence + orig max val */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}